

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_get_b32(uchar *bin,secp256k1_scalar *a)

{
  secp256k1_write_be64(bin,a->d[3]);
  secp256k1_write_be64(bin + 8,a->d[2]);
  secp256k1_write_be64(bin + 0x10,a->d[1]);
  secp256k1_write_be64(bin + 0x18,a->d[0]);
  return;
}

Assistant:

static void secp256k1_scalar_get_b32(unsigned char *bin, const secp256k1_scalar* a) {
    SECP256K1_SCALAR_VERIFY(a);

    secp256k1_write_be64(&bin[0],  a->d[3]);
    secp256k1_write_be64(&bin[8],  a->d[2]);
    secp256k1_write_be64(&bin[16], a->d[1]);
    secp256k1_write_be64(&bin[24], a->d[0]);
}